

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
QPDFObjectHandle::pipeStreamData
          (QPDFObjectHandle *this,Pipeline *p,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  QPDFObjectHandle local_38;
  bool local_23;
  byte local_22;
  byte local_21;
  qpdf_stream_decode_level_e local_20;
  bool filtering_attempted;
  bool will_retry_local;
  int iStack_1c;
  bool suppress_warnings_local;
  qpdf_stream_decode_level_e decode_level_local;
  int encode_flags_local;
  Pipeline *p_local;
  QPDFObjectHandle *this_local;
  
  local_22 = will_retry;
  local_21 = suppress_warnings;
  local_20 = decode_level;
  iStack_1c = encode_flags;
  _decode_level_local = p;
  p_local = (Pipeline *)this;
  as_stream(&local_38,(typed)this);
  ::qpdf::Stream::pipeStreamData
            ((Stream *)&local_38,_decode_level_local,&local_23,iStack_1c,local_20,
             (bool)(local_21 & 1),(bool)(local_22 & 1));
  ::qpdf::Stream::~Stream((Stream *)&local_38);
  return (bool)(local_23 & 1);
}

Assistant:

bool
QPDFObjectHandle::pipeStreamData(
    Pipeline* p,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    bool filtering_attempted;
    as_stream(error).pipeStreamData(
        p, &filtering_attempted, encode_flags, decode_level, suppress_warnings, will_retry);
    return filtering_attempted;
}